

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O0

void GetNodeTransform(aiMatrix4x4 *matrix,Node *node)

{
  aiMatrix4x4t<float> local_1e4;
  undefined1 local_1a4 [8];
  aiMatrix4x4 s;
  aiVector3D scal;
  aiMatrix4x4t<float> local_134;
  aiMatrix4x4t<float> local_f4;
  undefined1 local_b4 [8];
  aiQuaternion rot;
  undefined1 local_64 [8];
  aiMatrix4x4 t;
  aiVector3D trans;
  Node *node_local;
  aiMatrix4x4 *matrix_local;
  
  if (((node->matrix).isPresent & 1U) == 0) {
    if (((node->translation).isPresent & 1U) != 0) {
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)&t.d3);
      glTFCommon::CopyValue((node->translation).value,(aiVector3D *)&t.d3);
      aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)local_64);
      aiMatrix4x4t<float>::Translation((aiVector3t<float> *)&t.d3,(aiMatrix4x4t<float> *)local_64);
      aiMatrix4x4t<float>::operator*
                ((aiMatrix4x4t<float> *)&rot.y,matrix,(aiMatrix4x4t<float> *)local_64);
      memcpy(matrix,&rot.y,0x40);
    }
    if (((node->rotation).isPresent & 1U) != 0) {
      aiQuaterniont<float>::aiQuaterniont((aiQuaterniont<float> *)local_b4);
      glTFCommon::CopyValue((node->rotation).value,(aiQuaternion *)local_b4);
      aiQuaterniont<float>::GetMatrix
                ((aiMatrix3x3t<float> *)&scal.y,(aiQuaterniont<float> *)local_b4);
      aiMatrix4x4t<float>::aiMatrix4x4t(&local_134,(aiMatrix3x3t<float> *)&scal.y);
      aiMatrix4x4t<float>::operator*(&local_f4,matrix,&local_134);
      memcpy(matrix,&local_f4,0x40);
    }
    if (((node->scale).isPresent & 1U) != 0) {
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)&s.d3,1.0);
      glTFCommon::CopyValue((node->scale).value,(aiVector3D *)&s.d3);
      aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)local_1a4);
      aiMatrix4x4t<float>::Scaling((aiVector3t<float> *)&s.d3,(aiMatrix4x4t<float> *)local_1a4);
      aiMatrix4x4t<float>::operator*(&local_1e4,matrix,(aiMatrix4x4t<float> *)local_1a4);
      memcpy(matrix,&local_1e4,0x40);
    }
  }
  else {
    glTFCommon::CopyValue((node->matrix).value,matrix);
  }
  return;
}

Assistant:

static void GetNodeTransform(aiMatrix4x4& matrix, const glTF2::Node& node) {
    if (node.matrix.isPresent) {
        CopyValue(node.matrix.value, matrix);
    }
    else {
        if (node.translation.isPresent) {
            aiVector3D trans;
            CopyValue(node.translation.value, trans);
            aiMatrix4x4 t;
            aiMatrix4x4::Translation(trans, t);
            matrix = matrix * t;
        }

        if (node.rotation.isPresent) {
            aiQuaternion rot;
            CopyValue(node.rotation.value, rot);
            matrix = matrix * aiMatrix4x4(rot.GetMatrix());
        }

        if (node.scale.isPresent) {
            aiVector3D scal(1.f);
            CopyValue(node.scale.value, scal);
            aiMatrix4x4 s;
            aiMatrix4x4::Scaling(scal, s);
            matrix = matrix * s;
        }
    }
}